

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall Buffer_change_event_copyout_Test::TestBody(Buffer_change_event_copyout_Test *this)

{
  bool bVar1;
  pointer setme;
  char *pcVar2;
  AssertHelper local_148;
  Message local_140;
  size_type local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110;
  size_t local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  array<char,_8UL> local_e0;
  array<char,_8UL> array;
  undefined1 local_d0 [4];
  int wanted;
  BufferWithReadonlyStrings local;
  Buffer_change_event_copyout_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  array._M_elems[4] = '\b';
  array._M_elems[5] = '\0';
  array._M_elems[6] = '\0';
  array._M_elems[7] = '\0';
  local_e0._M_elems[0] = '\0';
  local_e0._M_elems[1] = '\0';
  local_e0._M_elems[2] = '\0';
  local_e0._M_elems[3] = '\0';
  local_e0._M_elems[4] = '\0';
  local_e0._M_elems[5] = '\0';
  local_e0._M_elems[6] = '\0';
  local_e0._M_elems[7] = '\0';
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)local_d0);
  setme = std::data<std::array<char,8ul>>(&local_e0);
  local_108 = bfy_buffer_copyout((bfy_buffer *)local_d0,8,setme);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_100,"wanted",
             "bfy_buffer_copyout(&local.buf, wanted, std::data(array))",(int *)(array._M_elems + 4),
             &local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5c6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_12c = 0;
  local_138 = std::size<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
                        ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
                         ((long)&local.allstrs.field_2 + 8));
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_128,"0","std::size(local.changes)",&local_12c,&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5c7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  return;
}

Assistant:

TEST(Buffer, change_event_copyout) {
    BufferWithReadonlyStrings local;
    auto constexpr wanted = 8;
    auto array = std::array<char, wanted> {};

    local.start_listening_to_changes();
    EXPECT_EQ(wanted, bfy_buffer_copyout(&local.buf, wanted, std::data(array)));
    EXPECT_EQ(0, std::size(local.changes));
}